

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operators.cpp
# Opt level: O2

bool duckdb::GreaterThanEquals::Operation<double>(double *left,double *right)

{
  bool bVar1;
  
  bVar1 = GreaterThanEqualsFloat<double>(*left,*right);
  return bVar1;
}

Assistant:

bool GreaterThanEquals::Operation(const double &left, const double &right) {
	return GreaterThanEqualsFloat<double>(left, right);
}